

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O2

int demmt_drm_ioctl_post
              (uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
              uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc)

{
  drm_nouveau_gem_new *g;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  gpu_object *pgVar15;
  FILE *pFVar16;
  mmt_buf *pmVar17;
  mmt_buf *pmVar18;
  mmt_buf *pmVar19;
  gpu_object *pgVar20;
  gpu_object *pgVar21;
  char *pcVar22;
  uint32_t uVar23;
  int iVar24;
  gpu_object **ppgVar25;
  uint32_t uVar26;
  char *pcVar27;
  char *pcVar28;
  char *__format;
  uint64_t ptr;
  char *pcVar29;
  char *pcVar30;
  uint uVar31;
  gpu_object *pgVar32;
  long lVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  char *pcVar37;
  char *pcVar38;
  char *pcVar39;
  char *pcVar40;
  char *pcVar41;
  
  pFVar16 = _stdout;
  iVar24 = indent_logs;
  g = (drm_nouveau_gem_new *)(buf + 1);
  if (id == 0x80046402) {
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    pcVar28 = colors->reset;
    pcVar30 = colors->rname;
    uVar31 = (g->info).handle;
    ret_err(ret,err);
    if (iVar24 == 0) {
      pcVar27 = "LOG: %sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n";
LAB_00249135:
      fprintf(pFVar16,pcVar27,pcVar30,pcVar28,(ulong)uVar31,ret_err::r);
    }
    else {
      pcVar27 = "%64s%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n";
LAB_002480f0:
      pcVar40 = ret_err::r;
LAB_00248107:
      fprintf(pFVar16,pcVar27," ",pcVar30,pcVar28,(ulong)uVar31,pcVar40);
    }
  }
  else if (id == 0xc008640a) {
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG: %sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",colors->rname,
              colors->reset,(ulong)buf[1].len,(ulong)buf[2].len);
    }
    else {
      fprintf(_stdout,"%64s%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n"," ");
    }
  }
  else if (id == 0xc0106407) {
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    if (indent_logs == 0) {
      fprintf(_stdout,
              "LOG: %sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
              ,colors->rname,colors->reset,(ulong)buf[1].len,(ulong)buf[2].len,(ulong)buf[3].len,
              (ulong)buf[4].len);
    }
    else {
      fprintf(_stdout,
              "%64s%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
              ," ");
    }
  }
  else if (id == 0xc010640b) {
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    pcVar28 = colors->reset;
    pcVar30 = colors->rname;
    pcVar27 = colors->eval;
    pcVar40 = colors->num;
    uVar31 = buf[1].len;
    uVar1 = buf[2].len;
    uVar10 = *(undefined8 *)(buf + 3);
    ret_err(ret,err);
    if (iVar24 == 0) {
      fprintf(pFVar16,
              "LOG: %sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
              pcVar30,pcVar28,pcVar27,(ulong)uVar31,pcVar28,pcVar40,(ulong)uVar1,pcVar28,uVar10,
              ret_err::r);
    }
    else {
      fprintf(pFVar16,
              "%64s%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n"," ",
              pcVar30,pcVar28,pcVar27,(ulong)uVar31,pcVar28,pcVar40,(ulong)uVar1,pcVar28,uVar10,
              ret_err::r);
    }
  }
  else if (id == 0xc010640c) {
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    pcVar28 = colors->rname;
    pcVar30 = colors->reset;
    pcVar27 = colors->iname;
    pcVar40 = colors->num;
    pcVar37 = *(char **)(buf + 1);
    pcVar39 = *(char **)(buf + 3);
    ret_err(ret,err);
    if (iVar24 == 0) {
      __format = "LOG: %sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n";
      pcVar41 = ret_err::r;
      pcVar22 = pcVar30;
      pcVar29 = pcVar27;
      pcVar27 = pcVar37;
      pcVar37 = pcVar30;
      pcVar38 = pcVar40;
      pcVar40 = pcVar39;
      pcVar39 = pcVar30;
    }
    else {
      __format = "%64s%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n";
      pcVar22 = pcVar28;
      pcVar28 = " ";
      pcVar29 = pcVar30;
      pcVar38 = pcVar30;
      pcVar41 = pcVar30;
    }
    fprintf(pFVar16,__format,pcVar28,pcVar22,pcVar29,pcVar27,pcVar37,pcVar38,pcVar40,pcVar39,pcVar41
           );
  }
  else {
    if (id != 0x40106441) {
      if (id == 0xc0106445) {
        if (dump_decoded_ioctl_data != 0) {
          pcVar28 = colors->reset;
          pcVar30 = colors->rname;
          uVar31 = buf[1].len;
          uVar1 = buf[2].len;
          uVar5 = buf[3].len;
          uVar6 = buf[4].len;
          ret_err(ret,err);
          if (iVar24 == 0) {
            fprintf(pFVar16,
                    "LOG: %sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                    ,pcVar30,pcVar28,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,(ulong)uVar6,ret_err::r
                   );
          }
          else {
            fprintf(pFVar16,
                    "%64s%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                    ," ",pcVar30,pcVar28,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,(ulong)uVar6,
                    ret_err::r);
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        gpu_object_add(fd,buf[1].len,buf[1].len,buf[2].len,0);
        return 0;
      }
      if (id == 0xc0246400) {
        if (dump_decoded_ioctl_data == 0) {
          return 0;
        }
        pcVar28 = colors->reset;
        pcVar30 = colors->rname;
        pcVar27 = colors->eval;
        uVar31 = buf[1].len;
        uVar1 = buf[2].len;
        uVar5 = buf[3].len;
        uVar6 = buf[5].len;
        uVar7 = buf[4].len;
        uVar8 = buf[7].len;
        uVar2 = buf[6].len;
        uVar3 = buf[9].len;
        uVar4 = buf[8].len;
        ret_err(ret,err);
        if (iVar24 == 0) {
          fprintf(pFVar16,
                  "LOG: %sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                  ,pcVar30,pcVar28,pcVar27,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,pcVar28,
                  (ulong)uVar6,(ulong)uVar7,(ulong)uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                  ret_err::r);
        }
        else {
          fprintf(pFVar16,
                  "%64s%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                  ," ",pcVar30,pcVar28,pcVar27,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,pcVar28,
                  (ulong)uVar6,(ulong)uVar7,(ulong)uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                  ret_err::r);
        }
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
        pmVar17 = find_ptr((ulong)buf[5].len,args,argc);
        if (pmVar17 != (mmt_buf *)0x0) {
          dump_mmt_buf_as_text(pmVar17,"name");
        }
        pmVar17 = find_ptr((ulong)buf[7].len,args,argc);
        if (pmVar17 != (mmt_buf *)0x0) {
          dump_mmt_buf_as_text(pmVar17,"date");
        }
        ptr = (uint64_t)buf[9].len;
LAB_00248c9c:
        pmVar17 = find_ptr(ptr,args,argc);
        if (pmVar17 != (mmt_buf *)0x0) {
          dump_mmt_buf_as_text(pmVar17,"desc");
          return 0;
        }
        return 0;
      }
      if (id == 0xc0286484) {
        if (dump_decoded_ioctl_data != 0) {
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_INFO%s post, ",colors->rname,colors->reset);
          }
          else {
            fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_INFO%s post, "," ");
          }
          dump_drm_nouveau_gem_info((drm_nouveau_gem_info *)g);
          pFVar16 = _stdout;
          ret_err(ret,err);
          fprintf(pFVar16,"%s\n",ret_err::r);
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        pgVar21 = (gpu_object *)0x0;
        ppgVar25 = &gpu_objects;
        pgVar32 = (gpu_object *)0x0;
        while (pgVar15 = *ppgVar25, pgVar15 != (gpu_object *)0x0) {
          pgVar20 = pgVar32;
          if (((pgVar15->class_ == 0x80) && (pgVar15->fd == fd)) &&
             (pgVar20 = gpu_object_find(pgVar15->cid,(g->info).handle), pgVar21 = pgVar15,
             pgVar32 != (gpu_object *)0x0 && pgVar20 != (gpu_object *)0x0)) {
            fprintf(_stdout,
                    "ERROR: can\'t uniquely determine object, assuming it\'s the first one%s\n","");
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
            goto LAB_00248ecf;
          }
          pgVar32 = pgVar20;
          ppgVar25 = &pgVar15->next;
        }
        if (pgVar21 == (gpu_object *)0x0) {
          pcVar28 = "ERROR: can\'t find matching device object%s\n";
        }
        else {
          if (pgVar32 == (gpu_object *)0x0) {
            uVar26 = pgVar21->cid;
            uVar23 = pgVar21->handle;
            goto LAB_00248b59;
          }
LAB_00248ecf:
          pcVar28 = "ERROR: FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n";
        }
        fprintf(_stdout,pcVar28,"");
      }
      else {
        if (id == 0xc0306480) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_NEW%s post, ",colors->rname,colors->reset);
            }
            else {
              fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_NEW%s post, "," ");
            }
            dump_drm_nouveau_gem_new(g);
            pFVar16 = _stdout;
            ret_err(ret,err);
            fprintf(pFVar16,"%s\n",ret_err::r);
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          uVar26 = buf[0xb].len;
          uVar23 = uVar26;
LAB_00248b59:
          drm_nouveau_gem_new(fd,uVar26,uVar23,(drm_nouveau_gem_info *)g);
          return 0;
        }
        if (id == 0xc0406400) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar28 = colors->reset;
          pcVar30 = colors->rname;
          pcVar27 = colors->eval;
          uVar31 = buf[1].len;
          uVar1 = buf[2].len;
          uVar5 = buf[3].len;
          uVar10 = *(undefined8 *)(buf + 7);
          uVar11 = *(undefined8 *)(buf + 5);
          uVar12 = *(undefined8 *)(buf + 0xb);
          uVar13 = *(undefined8 *)(buf + 9);
          uVar14 = *(undefined8 *)(buf + 0xf);
          uVar9 = *(undefined8 *)(buf + 0xd);
          ret_err(ret,err);
          if (iVar24 == 0) {
            fprintf(pFVar16,
                    "LOG: %sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                    ,pcVar30,pcVar28,pcVar27,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,pcVar28,uVar10,
                    uVar11,uVar12,uVar13,uVar14,uVar9,ret_err::r);
          }
          else {
            fprintf(pFVar16,
                    "%64s%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                    ," ",pcVar30,pcVar28,pcVar27,(ulong)uVar31,(ulong)uVar1,(ulong)uVar5,pcVar28,
                    uVar10,uVar11,uVar12,uVar13,uVar14,uVar9,ret_err::r);
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
          pmVar17 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
          if (pmVar17 != (mmt_buf *)0x0) {
            dump_mmt_buf_as_text(pmVar17,"name");
          }
          pmVar17 = find_ptr(*(uint64_t *)(buf + 0xb),args,argc);
          if (pmVar17 != (mmt_buf *)0x0) {
            dump_mmt_buf_as_text(pmVar17,"date");
          }
          ptr = *(uint64_t *)(buf + 0xf);
          goto LAB_00248c9c;
        }
        if (id == 0xc0406481) {
          pmVar17 = find_ptr(*(uint64_t *)(buf + 3),args,argc);
          pmVar18 = find_ptr(*(uint64_t *)(buf + 9),args,argc);
          pmVar19 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
          pFVar16 = _stdout;
          iVar24 = indent_logs;
          if (dump_decoded_ioctl_data != 0) {
            pcVar28 = colors->reset;
            pcVar30 = colors->rname;
            pcVar27 = colors->num;
            uVar31 = buf[1].len;
            uVar1 = buf[2].len;
            uVar10 = *(undefined8 *)(buf + 3);
            uVar5 = buf[5].len;
            uVar11 = *(undefined8 *)(buf + 7);
            uVar6 = buf[6].len;
            uVar12 = *(undefined8 *)(buf + 9);
            uVar7 = buf[0xb].len;
            uVar8 = buf[0xc].len;
            uVar13 = *(undefined8 *)(buf + 0xd);
            uVar14 = *(undefined8 *)(buf + 0xf);
            ret_err(ret,err);
            if (iVar24 == 0) {
              fprintf(pFVar16,
                      "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                      ,pcVar30,pcVar28,(ulong)uVar31,pcVar27,(ulong)uVar1,pcVar28,uVar10,pcVar27,
                      (ulong)uVar5,pcVar28,uVar11,pcVar27,(ulong)uVar6,pcVar28,uVar12,(ulong)uVar7,
                      (ulong)uVar8,uVar13,uVar14,ret_err::r);
            }
            else {
              fprintf(pFVar16,
                      "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                      ," ",pcVar30,pcVar28,(ulong)uVar31,pcVar27,(ulong)uVar1,pcVar28,uVar10,pcVar27
                      ,(ulong)uVar5,pcVar28,uVar11,pcVar27,(ulong)uVar6,pcVar28,uVar12,(ulong)uVar7,
                      (ulong)uVar8,uVar13,uVar14,ret_err::r);
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          if ((pmVar17 != (mmt_buf *)0x0 || pmVar18 != (mmt_buf *)0x0) || pmVar19 != (mmt_buf *)0x0)
          {
            demmt_nouveau_decode_gem_pushbuf_data
                      (buf[2].len,(drm_nouveau_gem_pushbuf_bo *)(pmVar17 + 1),buf[6].len,
                       (drm_nouveau_gem_pushbuf_push *)(pmVar18 + 1),buf[5].len,
                       (drm_nouveau_gem_pushbuf_reloc *)(pmVar19 + 1));
            return 0;
          }
          return 0;
        }
        if (id == 0xc04064a0) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                    ,colors->rname,colors->reset,*(undefined8 *)(buf + 1),*(undefined8 *)(buf + 3),
                    *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),(ulong)buf[9].len,
                    (ulong)buf[10].len,(ulong)buf[0xb].len,(ulong)buf[0xc].len,(ulong)buf[0xd].len,
                    (ulong)buf[0xe].len,(ulong)buf[0xf].len,(ulong)buf[0x10].len);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                    ," ");
          }
          goto joined_r0x00248e50;
        }
        if (id == 0xc0586442) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,
                      "LOG: %sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                      ,colors->rname,colors->reset,(ulong)buf[1].len,(ulong)buf[2].len,
                      (ulong)buf[3].len);
            }
            else {
              fprintf(_stdout,
                      "%64s%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                      ," ");
            }
            decode_domain(buf[4].len,10);
            fprintf(_stdout,", notifier: 0x%0x, nr_subchan: %d",(ulong)buf[5].len,
                    (ulong)buf[0x16].len);
            for (uVar34 = 0; pFVar16 = _stdout, uVar34 != 8; uVar34 = uVar34 + 1) {
              if (buf[uVar34 * 2 + 6].len != 0 || buf[uVar34 * 2 + 7].len != 0) {
                fprintf(_stdout," subchan[%d]=<h:0x%0x, c:0x%0x>",uVar34 & 0xffffffff);
              }
            }
            ret_err(ret,err);
            fprintf(pFVar16,"%s\n",ret_err::r);
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          uVar23 = buf[3].len;
          pgVar21 = gpu_object_add(fd,uVar23,uVar23,uVar23,0x80);
          nvrm_device_set_chipset(pgVar21,demmt_drm_ioctl_post::nouveau_chipset);
          pgVar21 = gpu_object_add(fd,buf[3].len,buf[3].len,0xf1f0eeee,0x506f);
          get_fifo_state(pgVar21);
          return 0;
        }
        if (id == 0x641e) {
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar28 = colors->reset;
          pcVar30 = colors->rname;
          if (indent_logs == 0) {
            pcVar27 = "LOG: %sDRM_IOCTL_SET_MASTER%s\n";
LAB_00248ae4:
            fprintf(_stdout,pcVar27,pcVar30,pcVar28);
            goto LAB_00248ef0;
          }
          pcVar28 = "%64s%sDRM_IOCTL_SET_MASTER%s\n";
        }
        else {
          if (id != 0x641f) {
            if (id == 0x40046411) {
              if (dump_decoded_ioctl_data == 0) {
                return 0;
              }
              if (indent_logs == 0) {
                fprintf(_stdout,"LOG: %sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n",colors->rname,
                        colors->reset,(ulong)(g->info).handle);
              }
              else {
                fprintf(_stdout,"%64s%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n"," ");
              }
              goto LAB_00248ef0;
            }
            if (id == 0x40046443) {
              if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
                pcVar28 = colors->reset;
                pcVar30 = colors->rname;
                uVar31 = (g->info).handle;
                ret_err(ret,err);
                if (iVar24 == 0) {
                  fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n",pcVar30,
                          pcVar28,(ulong)uVar31,ret_err::r);
                }
                else {
                  fprintf(pFVar16,"%64s%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n"," ",pcVar30,
                          pcVar28,(ulong)uVar31,ret_err::r);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
              pgVar21 = gpu_object_find((g->info).handle,0xf1f0eeee);
              for (lVar33 = 0; lVar33 < pgVar21->children_space; lVar33 = lVar33 + 1) {
                if (pgVar21->children_objects[lVar33] != (gpu_object *)0x0) {
                  gpu_object_destroy(pgVar21->children_objects[lVar33]);
                }
              }
              gpu_object_destroy(pgVar21);
              uVar23 = (g->info).handle;
              uVar26 = uVar23;
LAB_00249052:
              pgVar21 = gpu_object_find(uVar23,uVar26);
              gpu_object_destroy(pgVar21);
              return 0;
            }
            if (id == 0x40046483) {
              if (err == 0 && ret == 0) {
                return 0;
              }
              if (dump_decoded_ioctl_data == 0) {
                return 0;
              }
              pcVar28 = colors->reset;
              pcVar30 = colors->rname;
              uVar31 = (g->info).handle;
              ret_err(ret,err);
              if (iVar24 == 0) {
                pcVar27 = "LOG: %sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n";
                goto LAB_00249135;
              }
              pcVar27 = "%64s%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n";
              goto LAB_002480f0;
            }
            if (id == 0x40086409) {
              if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
                pcVar28 = colors->reset;
                pcVar30 = colors->rname;
                uVar31 = (g->info).handle;
                ret_err(ret,err);
                if (iVar24 == 0) {
                  fprintf(pFVar16,"LOG: %sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n",pcVar30,pcVar28,
                          (ulong)uVar31,ret_err::r);
                }
                else {
                  fprintf(pFVar16,"%64s%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n"," ",pcVar30,pcVar28,
                          (ulong)uVar31,ret_err::r);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
              pgVar21 = gpu_object_find(0,(g->info).handle);
              if (pgVar21 != (gpu_object *)0x0) {
                gpu_object_destroy(pgVar21);
                return 0;
              }
              return 0;
            }
            if (id == 0x40086446) {
              if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
                pcVar28 = colors->reset;
                pcVar30 = colors->rname;
                uVar31 = buf[1].len;
                uVar1 = buf[2].len;
                ret_err(ret,err);
                if (iVar24 == 0) {
                  fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n"
                          ,pcVar30,pcVar28,(ulong)uVar31,(ulong)uVar1,ret_err::r);
                }
                else {
                  fprintf(pFVar16,"%64s%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
                          " ",pcVar30,pcVar28,(ulong)uVar31,(ulong)uVar1,ret_err::r);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
              uVar23 = buf[1].len;
              uVar26 = buf[2].len;
              goto LAB_00249052;
            }
            if (id != 0x40086482) {
              if (id == 0x400c6444) {
                if ((err != 0 || ret != 0) && (dump_decoded_ioctl_data != 0)) {
                  pcVar28 = colors->reset;
                  pcVar30 = colors->rname;
                  pcVar27 = colors->num;
                  uVar23 = buf[1].len;
                  uVar31 = buf[2].len;
                  pcVar40 = colors->eval;
                  uVar1 = buf[3].len;
                  ret_err(ret,err);
                  if (iVar24 == 0) {
                    fprintf(pFVar16,
                            "LOG: %sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                            ,pcVar30,pcVar28,uVar23,pcVar27,(ulong)uVar31,pcVar28,pcVar40,
                            (ulong)uVar1,pcVar28,ret_err::r);
                  }
                  else {
                    fprintf(pFVar16,
                            "%64s%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                            ," ",pcVar30,pcVar28,uVar23,pcVar27,(ulong)uVar31,pcVar28,pcVar40,
                            (ulong)uVar1,pcVar28,ret_err::r);
                  }
                  if (mmt_sync_fd != -1) {
                    fflush(_stdout);
                  }
                }
                pgVar21 = gpu_object_add(fd,buf[1].len,0xf1f0eeee,buf[2].len,buf[3].len);
                pushbuf_add_object(buf[2].len,buf[3].len,pgVar21);
                pushbuf_add_object_name(buf[2].len,buf[3].len,pgVar21);
                return 0;
              }
              if (id == 0xc0106440) {
                if (dump_decoded_ioctl_data != 0) {
                  pcVar28 = colors->reset;
                  uVar34 = *(ulong *)&g->info;
                  if (indent_logs == 0) {
                    if (uVar34 < 0xe) {
                      pcVar30 = nouveau_param_names[uVar34] + 0x11;
                    }
                    else {
                      pcVar30 = "???";
                    }
                    fprintf(_stdout,
                            "LOG: %sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s"
                            ,colors->rname,pcVar28,colors->eval,pcVar30,pcVar28,uVar34,colors->num,
                            *(undefined8 *)(buf + 3),pcVar28);
                  }
                  else {
                    if (uVar34 < 0xe) {
                      pcVar30 = nouveau_param_names[uVar34] + 0x11;
                    }
                    else {
                      pcVar30 = "???";
                    }
                    fprintf(_stdout,
                            "%64s%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s"
                            ," ",colors->rname,pcVar28,colors->eval,pcVar30,pcVar28,uVar34,
                            colors->num,*(undefined8 *)(buf + 3),pcVar28);
                  }
                  if (((undefined1  [40])g->info & (undefined1  [40])0xfffffffffffffffe) ==
                      (undefined1  [40])0x8) {
                    auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)*(undefined8 *)(buf + 3));
                    auVar35._8_4_ = (int)((ulong)*(undefined8 *)(buf + 3) >> 0x20);
                    auVar35._12_4_ = 0x45300000;
                    fprintf(_stdout," (%f MB)",
                            ((auVar35._8_8_ - 1.9342813113834067e+25) +
                            (auVar35._0_8_ - 4503599627370496.0)) * 9.5367431640625e-07);
                    uVar34 = *(ulong *)(buf + 3);
                    if (0x3fffffff < uVar34) {
                      auVar36._8_4_ = (int)(uVar34 >> 0x20);
                      auVar36._0_8_ = uVar34;
                      auVar36._12_4_ = 0x45300000;
                      fprintf(_stdout," (%f GB)",
                              ((auVar36._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar34) - 4503599627370496.0)) *
                              9.313225746154785e-10);
                    }
                  }
                  pFVar16 = _stdout;
                  ret_err(ret,err);
                  fprintf(pFVar16,"%s\n",ret_err::r);
                  if (mmt_sync_fd != -1) {
                    fflush(_stdout);
                  }
                }
                lVar33._0_4_ = (g->info).handle;
                lVar33._4_4_ = (g->info).domain;
                if (lVar33 == 0xb) {
                  demmt_drm_ioctl_post::nouveau_chipset = buf[3].len;
                  return 0;
                }
                return 0;
              }
              if (indent_logs == 0) {
                fprintf(_stdout,"LOG: %sunknown drm ioctl%s %x\n",colors->err,colors->reset,
                        (ulong)nr);
              }
              else {
                fprintf(_stdout,"%64s%sunknown drm ioctl%s %x\n"," ",colors->err);
              }
              iVar24 = 1;
              goto joined_r0x00248e50;
            }
            if (err == 0 && ret == 0) {
              return 0;
            }
            if (dump_decoded_ioctl_data == 0) {
              return 0;
            }
            pcVar28 = colors->reset;
            pcVar30 = colors->rname;
            uVar31 = buf[1].len;
            pcVar40 = (char *)(ulong)buf[2].len;
            ret_err(ret,err);
            if (iVar24 != 0) {
              pcVar27 = "%64s%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n";
              goto LAB_00248107;
            }
            fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",
                    pcVar30,pcVar28,uVar31,pcVar40,ret_err::r);
            goto joined_r0x00248e50;
          }
          if (dump_decoded_ioctl_data == 0) {
            return 0;
          }
          pcVar28 = colors->reset;
          pcVar30 = colors->rname;
          if (indent_logs == 0) {
            pcVar27 = "LOG: %sDRM_IOCTL_DROP_MASTER%s\n";
            goto LAB_00248ae4;
          }
          pcVar28 = "%64s%sDRM_IOCTL_DROP_MASTER%s\n";
        }
        fprintf(_stdout,pcVar28," ");
      }
LAB_00248ef0:
      iVar24 = 0;
      goto joined_r0x00248e50;
    }
    if (err == 0 && ret == 0) {
      return 0;
    }
    if (dump_decoded_ioctl_data == 0) {
      return 0;
    }
    pcVar28 = colors->reset;
    pcVar30 = colors->rname;
    uVar34 = *(ulong *)&g->info;
    if (indent_logs == 0) {
      if (uVar34 < 0xe) {
        pcVar27 = nouveau_param_names[uVar34];
      }
      else {
        pcVar27 = "???";
      }
      uVar10 = *(undefined8 *)(buf + 3);
      ret_err(ret,err);
      fprintf(pFVar16,"LOG: %sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n",pcVar30,
              pcVar28,pcVar27,uVar34,uVar10,ret_err::r);
    }
    else {
      if (uVar34 < 0xe) {
        pcVar27 = nouveau_param_names[uVar34];
      }
      else {
        pcVar27 = "???";
      }
      uVar10 = *(undefined8 *)(buf + 3);
      ret_err(ret,err);
      fprintf(pFVar16,"%64s%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n"," ",
              pcVar30,pcVar28,pcVar27,uVar34,uVar10,ret_err::r);
    }
  }
joined_r0x00248e50:
  iVar24 = 0;
joined_r0x00248e50:
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return iVar24;
}

Assistant:

int demmt_drm_ioctl_post(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr, uint16_t size,
		struct mmt_buf *buf, uint64_t ret, uint64_t err, void *state,
		struct mmt_memory_dump *args, int argc)
{
	static int nouveau_chipset; // hack

	void *ioctl_data = buf->data;

	int i;
	if (id == DRM_NOUVEAU_IOCTL_GETPARAM)
	{
		struct drm_nouveau_getparam *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%" PRIx64 "), value: %s0x%" PRIx64 "%s",
					colors->rname, colors->reset, colors->eval,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] + 17 : "???",
					colors->reset, data->param, colors->num, data->value, colors->reset);
			switch (data->param)
			{
				case NOUVEAU_GETPARAM_FB_SIZE:
				case NOUVEAU_GETPARAM_AGP_SIZE:
					mmt_log_cont(" (%f MB)", ((double)data->value) / (1 << 20));
					if (data->value >> 30 > 0)
						mmt_log_cont(" (%f GB)", ((double)data->value) / (1 << 30));
					break;
				default:
					break;
			}
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		if (data->param == NOUVEAU_GETPARAM_CHIPSET_ID)
			nouveau_chipset = data->value;
	}
	else if (id == DRM_NOUVEAU_IOCTL_SETPARAM)
	{
		struct drm_nouveau_setparam *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%" PRIx64 "), value: 0x%" PRIx64 "%s\n",
					colors->rname, colors->reset,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					data->param, data->value, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_ALLOC)
	{
		struct drm_nouveau_channel_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: ",
					colors->rname, colors->reset, data->fb_ctxdma_handle,
					data->tt_ctxdma_handle, data->channel);

			decode_domain(data->pushbuf_domains, 10);

			mmt_log_cont(", notifier: 0x%0x, nr_subchan: %d", data->notifier_handle, data->nr_subchan);

			for (i = 0; i < 8; ++i)
				if (data->subchan[i].handle || data->subchan[i].grclass)
					mmt_log_cont(" subchan[%d]=<h:0x%0x, c:0x%0x>", i, data->subchan[i].handle, data->subchan[i].grclass);

			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		// hack, fake device
		struct gpu_object *dev = gpu_object_add(fd, data->channel, data->channel, data->channel, NVRM_DEVICE_0);
		nvrm_device_set_chipset(dev, nouveau_chipset);

		// hack, fake fifo
		struct gpu_object *fifo = gpu_object_add(fd, data->channel, data->channel, 0xf1f0eeee, NVRM_FIFO_IB_G80);
		get_fifo_state(fifo);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_FREE)
	{
		struct drm_nouveau_channel_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n", colors->rname,
					colors->reset, data->channel, ret_err(ret, err));

		struct gpu_object *fifo = gpu_object_find(data->channel, 0xf1f0eeee);
		int i;
		for (i = 0; i < fifo->children_space; ++i)
			if (fifo->children_objects[i])
				gpu_object_destroy(fifo->children_objects[i]);
		gpu_object_destroy(fifo);
		gpu_object_destroy(gpu_object_find(data->channel, data->channel));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GROBJ_ALLOC)
	{
		struct drm_nouveau_grobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->handle, colors->reset, colors->eval, data->class,
					colors->reset, ret_err(ret, err));

		struct gpu_object *gpu_obj = gpu_object_add(fd, data->channel, 0xf1f0eeee, data->handle, data->class);
		pushbuf_add_object(data->handle, data->class, gpu_obj);
		pushbuf_add_object_name(data->handle, data->class, gpu_obj);
	}
	else if (id == DRM_NOUVEAU_IOCTL_NOTIFIEROBJ_ALLOC)
	{
		struct drm_nouveau_notifierobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					data->size, data->offset, ret_err(ret, err));

		gpu_object_add(fd, data->channel, data->channel, data->handle, 0);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GPUOBJ_FREE)
	{
		struct drm_nouveau_gpuobj_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					ret_err(ret, err));

		gpu_object_destroy(gpu_object_find(data->channel, data->handle));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_NEW)
	{
		struct drm_nouveau_gem_new *g = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_NEW%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_new(g);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		drm_nouveau_gem_new(fd, g->channel_hint, g->channel_hint, &g->info);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_PUSHBUF)
	{
		struct drm_nouveau_gem_pushbuf *data = ioctl_data;

		struct mmt_buf *buffers = find_ptr(data->buffers, args, argc);
		struct mmt_buf *push = find_ptr(data->push, args, argc);
		struct mmt_buf *relocs = find_ptr(data->relocs, args, argc);

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%" PRIx64 ", nr_relocs: %s%d%s, relocs: 0x%" PRIx64 ", nr_push: %s%d%s, push: 0x%" PRIx64 ", suffix0: 0x%x, suffix1: 0x%x, vram_available: %" PRIu64 ", gart_available: %" PRIu64 "%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->nr_buffers, colors->reset, data->buffers, colors->num,
					data->nr_relocs, colors->reset,data->relocs, colors->num,
					data->nr_push, colors->reset, data->push, data->suffix0,
					data->suffix1, data->vram_available, data->gart_available,
					ret_err(ret, err));

		if (buffers || push || relocs)
			demmt_nouveau_decode_gem_pushbuf_data(data->nr_buffers, (void *)buffers->data,
					data->nr_push, (void *)push->data, data->nr_relocs, (void *)relocs->data);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_PREP)
	{
		struct drm_nouveau_gem_cpu_prep *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",
					colors->rname, colors->reset, data->handle, data->flags,
					ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_FINI)
	{
		struct drm_nouveau_gem_cpu_fini *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_INFO)
	{
		struct drm_nouveau_gem_info *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_INFO%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_info(data);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		struct gpu_object *tmp, *dev = NULL, *obj = NULL;
		for (tmp = gpu_objects; tmp != NULL; tmp = tmp->next)
		{
			if (tmp->class_ == NVRM_DEVICE_0 && tmp->fd == fd)
			{
				dev = tmp;

				struct gpu_object *tmpobj = gpu_object_find(tmp->cid, data->handle);
				if (tmpobj && obj)
				{
					mmt_error("can't uniquely determine object, assuming it's the first one%s\n", "");
					break;
				}
				obj = tmpobj;
			}
		}

		if (!dev)
			mmt_error("can't find matching device object%s\n", "");
		else if (obj)
			mmt_error("FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n", "");
		else
			drm_nouveau_gem_new(fd, dev->cid, dev->handle, data);
	}
	else if (id == DRM_IOCTL_VERSION64)
	{
		struct drm_version64 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%"PRIx64", name_len: %"PRIu64", date_addr: 0x%"PRIx64", date_len: %"PRIu64", desc_addr: 0x%"PRIx64", desc_len: %"PRIu64"%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_VERSION32)
	{
		struct drm_version32 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_GET_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n", colors->rname,
					colors->reset, data->magic, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GEM_CLOSE)
	{
		struct drm_gem_close *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
		struct gpu_object *obj = gpu_object_find(0, data->handle); // won't work for objects allocated by GEM_OPEN
		if (obj)
			gpu_object_destroy(obj);
	}
	else if (id == DRM_IOCTL_GEM_OPEN)
	{
		struct drm_gem_open *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
					colors->rname, colors->reset, colors->eval, data->name,
					colors->reset, colors->num, data->handle, colors->reset,
					data->size, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GET_CAP)
	{
		struct drm_get_cap *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n",
					colors->rname, colors->reset, colors->iname, data->capability,
					colors->reset, colors->num, data->value, colors->reset,
					ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_SET_VERSION)
	{
		struct drm_set_version *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n",
					colors->rname, colors->reset, data->drm_di_major,
					data->drm_di_minor, data->drm_dd_major, data->drm_dd_minor);
	}
	else if (id == DRM_IOCTL_MODE_GETRESOURCES)
	{
		struct drm_mode_card_res *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, "
					"encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, "
					"min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n", colors->rname,
					colors->reset,
					(void *)(uintptr_t)data->fb_id_ptr,
					(void *)(uintptr_t)data->crtc_id_ptr,
					(void *)(uintptr_t)data->connector_id_ptr,
					(void *)(uintptr_t)data->encoder_id_ptr,
					data->count_fbs, data->count_crtcs, data->count_connectors,
					data->count_encoders, data->min_width, data->max_width,
					data->min_height, data->max_height);
	}
	else if (id == DRM_IOCTL_SET_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_DROP_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_DROP_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_AUTH_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n", colors->rname, colors->reset, data->magic);
	}
	else if (id == DRM_IOCTL_GEM_FLINK)
	{
		struct drm_gem_flink *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",
					colors->rname, colors->reset, data->handle, data->name);
	}
	else
	{
		mmt_log("%sunknown drm ioctl%s %x\n", colors->err, colors->reset, nr);
		return 1;
	}

	return 0;
}